

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O0

void pzshape::TPZShapeTriang::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *poVar1;
  void *this;
  TPZFMatrix<double> *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  int in_EDI;
  TPZFMatrix<double> *in_R8;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFMatrix<double> *in_stack_00000cc8;
  TPZFMatrix<double> *in_stack_00000cd0;
  int in_stack_00000cdc;
  TPZVec<double> *in_stack_00000ce0;
  
  if ((in_EDI < 3) || (6 < in_EDI)) {
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  if (in_EDI - 3U < 3) {
    TPZShapeLinear::ShapeInternal(in_RSI,in_EDX,in_RCX,in_R8);
  }
  else if (in_EDI == 6) {
    ShapeInternal(in_stack_00000ce0,in_stack_00000cdc,in_stack_00000cd0,in_stack_00000cc8);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "static void pzshape::TPZShapeTriang::ShapeInternal(int, TPZVec<REAL> &, int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &)"
                            );
    poVar1 = std::operator<<(poVar1," Wrong side parameter side ");
    this = (void *)std::ostream::operator<<(poVar1,in_EDI);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  return;
}

Assistant:

void TPZShapeTriang::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        if (side < 3 || side > 6) {
            DebugStop();
        }
        
        switch (side) {
                
            case 3:
            case 4:
            case 5:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 6:
            {
                
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
                std::cout << __PRETTY_FUNCTION__ << " Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }
      
        
        
    }